

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

int png_safe_execute(png_imagep image_in,_func_int_png_voidp *function,png_voidp arg)

{
  png_voidp pvVar1;
  int iVar2;
  undefined1 local_108 [8];
  jmp_buf safe_jmpbuf;
  png_voidp saved_error_buf;
  int result;
  png_imagep image;
  png_voidp arg_local;
  _func_int_png_voidp *function_local;
  png_imagep image_in_local;
  
  pvVar1 = image_in->opaque->error_buf;
  iVar2 = _setjmp((__jmp_buf_tag *)local_108);
  saved_error_buf._4_4_ = (uint)(iVar2 == 0);
  if (saved_error_buf._4_4_ != 0) {
    image_in->opaque->error_buf = local_108;
    saved_error_buf._4_4_ = (*function)(arg);
  }
  image_in->opaque->error_buf = pvVar1;
  if (saved_error_buf._4_4_ == 0) {
    png_image_free(image_in);
  }
  return saved_error_buf._4_4_;
}

Assistant:

int /* PRIVATE */
png_safe_execute(png_imagep image_in, int (*function)(png_voidp), png_voidp arg)
{
   volatile png_imagep image = image_in;
   volatile int result;
   volatile png_voidp saved_error_buf;
   jmp_buf safe_jmpbuf;

   /* Safely execute function(arg) with png_error returning to this function. */
   saved_error_buf = image->opaque->error_buf;
   result = setjmp(safe_jmpbuf) == 0;

   if (result != 0)
   {

      image->opaque->error_buf = safe_jmpbuf;
      result = function(arg);
   }

   image->opaque->error_buf = saved_error_buf;

   /* And do the cleanup prior to any failure return. */
   if (result == 0)
      png_image_free(image);

   return result;
}